

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# builtin_kernel.cxx
# Opt level: O3

void ExchCXX::detail::host_eval_exc_vxc_inc_helper_unpolar<ExchCXX::BuiltinVWN3>
               (double scal_fact,int N,const_host_buffer_type rho,host_buffer_type eps,
               host_buffer_type vxc)

{
  ulong uVar1;
  double dVar2;
  double dVar3;
  double e;
  double v;
  double local_40;
  double local_38;
  
  if (0 < N) {
    uVar1 = 0;
    do {
      dVar2 = 0.0;
      dVar3 = 0.0;
      if (1e-24 < rho[uVar1]) {
        kernel_traits<ExchCXX::BuiltinVWN3>::eval_exc_vxc_unpolar_impl
                  (rho[uVar1],&local_40,&local_38);
        dVar2 = local_38;
        dVar3 = local_40;
      }
      eps[uVar1] = dVar3 * scal_fact + eps[uVar1];
      vxc[uVar1] = dVar2 * scal_fact + vxc[uVar1];
      uVar1 = uVar1 + 1;
    } while ((uint)N != uVar1);
  }
  return;
}

Assistant:

LDA_EXC_VXC_INC_GENERATOR( host_eval_exc_vxc_inc_helper_unpolar ) {

  using traits = kernel_traits<KernelType>;
  
  for( int32_t i = 0; i < N; ++i ) {

    double v,e;
    traits::eval_exc_vxc_unpolar( rho[i], e, v );
    eps[i] += scal_fact * e;
    vxc[i] += scal_fact * v;

  }

}